

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O0

HighsBasis * __thiscall HEkk::getHighsBasis(HEkk *this,HighsLp *use_lp)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  reference pvVar5;
  const_reference pvVar6;
  const_reference pvVar7;
  reference pvVar8;
  int *in_RDX;
  long in_RSI;
  HighsBasis *in_RDI;
  double dVar9;
  double dual_1;
  HighsBasisStatus basis_status_1;
  double upper_1;
  double lower_1;
  HighsInt iVar_1;
  HighsInt iRow;
  double dual;
  HighsBasisStatus basis_status;
  double upper;
  double lower;
  HighsInt iVar;
  HighsInt iCol;
  HighsInt num_row;
  HighsInt num_col;
  HighsBasis *highs_basis;
  value_type local_b2;
  undefined6 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5e;
  undefined1 in_stack_ffffffffffffff5f;
  HighsBasis *this_00;
  value_type local_79;
  int local_64;
  value_type local_51;
  int local_38;
  
  iVar2 = *in_RDX;
  iVar3 = in_RDX[1];
  this_00 = in_RDI;
  HighsBasis::HighsBasis(in_RDI);
  std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::resize
            ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)this_00,
             CONCAT17(in_stack_ffffffffffffff5f,
                      CONCAT16(in_stack_ffffffffffffff5e,in_stack_ffffffffffffff58)));
  std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::resize
            ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)this_00,
             CONCAT17(in_stack_ffffffffffffff5f,
                      CONCAT16(in_stack_ffffffffffffff5e,in_stack_ffffffffffffff58)));
  in_RDI->valid = false;
  for (local_38 = 0; local_38 < iVar2; local_38 = local_38 + 1) {
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDX + 8),(long)local_38);
    dVar9 = *pvVar5;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDX + 0xe),(long)local_38);
    dVar1 = *pvVar5;
    local_51 = kNonbasic;
    pvVar6 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                       ((vector<signed_char,_std::allocator<signed_char>_> *)(in_RSI + 0x2990),
                        (long)local_38);
    if (*pvVar6 == '\0') {
      local_51 = kBasic;
    }
    else {
      pvVar6 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                         ((vector<signed_char,_std::allocator<signed_char>_> *)(in_RSI + 0x29a8),
                          (long)local_38);
      if (*pvVar6 == '\x01') {
        local_51 = kLower;
      }
      else {
        pvVar6 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                           ((vector<signed_char,_std::allocator<signed_char>_> *)(in_RSI + 0x29a8),
                            (long)local_38);
        if (*pvVar6 == -1) {
          local_51 = kUpper;
        }
        else {
          pvVar6 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                             ((vector<signed_char,_std::allocator<signed_char>_> *)(in_RSI + 0x29a8)
                              ,(long)local_38);
          if (*pvVar6 == '\0') {
            if ((dVar9 != dVar1) || (NAN(dVar9) || NAN(dVar1))) {
              local_51 = kZero;
            }
            else {
              iVar4 = *(int *)(in_RSI + 0x2288);
              pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                                 ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x2578),
                                  (long)local_38);
              local_51 = kLower;
              if ((double)iVar4 * *pvVar7 < 0.0) {
                local_51 = kUpper;
              }
            }
          }
        }
      }
    }
    pvVar8 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                       (&in_RDI->col_status,(long)local_38);
    *pvVar8 = local_51;
  }
  for (local_64 = 0; local_64 < iVar3; local_64 = local_64 + 1) {
    iVar4 = iVar2 + local_64;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDX + 0x14),(long)local_64);
    dVar9 = *pvVar5;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDX + 0x1a),(long)local_64);
    dVar1 = *pvVar5;
    local_79 = kNonbasic;
    pvVar6 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                       ((vector<signed_char,_std::allocator<signed_char>_> *)(in_RSI + 0x2990),
                        (long)iVar4);
    if (*pvVar6 == '\0') {
      local_79 = kBasic;
    }
    else {
      pvVar6 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                         ((vector<signed_char,_std::allocator<signed_char>_> *)(in_RSI + 0x29a8),
                          (long)iVar4);
      if (*pvVar6 == '\x01') {
        local_79 = kUpper;
      }
      else {
        pvVar6 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                           ((vector<signed_char,_std::allocator<signed_char>_> *)(in_RSI + 0x29a8),
                            (long)iVar4);
        if (*pvVar6 == -1) {
          local_79 = kLower;
        }
        else {
          pvVar6 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                             ((vector<signed_char,_std::allocator<signed_char>_> *)(in_RSI + 0x29a8)
                              ,(long)iVar4);
          if (*pvVar6 == '\0') {
            if ((dVar9 != dVar1) || (NAN(dVar9) || NAN(dVar1))) {
              local_79 = kZero;
            }
            else {
              dVar9 = (double)*(int *)(in_RSI + 0x2288);
              pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                                 ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x2578),
                                  (long)iVar4);
              local_b2 = kLower;
              if (dVar9 * *pvVar7 < 0.0) {
                local_b2 = kUpper;
              }
              local_79 = local_b2;
            }
          }
        }
      }
    }
    pvVar8 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                       (&in_RDI->row_status,(long)local_64);
    *pvVar8 = local_79;
  }
  in_RDI->valid = true;
  in_RDI->alien = false;
  in_RDI->useful = true;
  in_RDI->was_alien = false;
  in_RDI->debug_id = (int)(*(double *)(in_RSI + 0x3850) + *(double *)(in_RSI + 0x3858));
  in_RDI->debug_update_count = *(HighsInt *)(in_RSI + 0x2944);
  std::__cxx11::string::operator=((string *)&in_RDI->debug_origin_name,(string *)(in_RSI + 0x29d0));
  return this_00;
}

Assistant:

HighsBasis HEkk::getHighsBasis(HighsLp& use_lp) const {
  HighsInt num_col = use_lp.num_col_;
  HighsInt num_row = use_lp.num_row_;
  HighsBasis highs_basis;
  highs_basis.col_status.resize(num_col);
  highs_basis.row_status.resize(num_row);
  assert(status_.has_basis);
  highs_basis.valid = false;
  for (HighsInt iCol = 0; iCol < num_col; iCol++) {
    HighsInt iVar = iCol;
    const double lower = use_lp.col_lower_[iCol];
    const double upper = use_lp.col_upper_[iCol];
    HighsBasisStatus basis_status = HighsBasisStatus::kNonbasic;
    if (!basis_.nonbasicFlag_[iVar]) {
      basis_status = HighsBasisStatus::kBasic;
    } else if (basis_.nonbasicMove_[iVar] == kNonbasicMoveUp) {
      basis_status = HighsBasisStatus::kLower;
    } else if (basis_.nonbasicMove_[iVar] == kNonbasicMoveDn) {
      basis_status = HighsBasisStatus::kUpper;
    } else if (basis_.nonbasicMove_[iVar] == kNonbasicMoveZe) {
      if (lower == upper) {
        const double dual = (HighsInt)lp_.sense_ * info_.workDual_[iCol];
        basis_status =
            dual >= 0 ? HighsBasisStatus::kLower : HighsBasisStatus::kUpper;
      } else {
        basis_status = HighsBasisStatus::kZero;
      }
    }
    highs_basis.col_status[iCol] = basis_status;
  }
  for (HighsInt iRow = 0; iRow < num_row; iRow++) {
    HighsInt iVar = num_col + iRow;
    const double lower = use_lp.row_lower_[iRow];
    const double upper = use_lp.row_upper_[iRow];
    HighsBasisStatus basis_status = HighsBasisStatus::kNonbasic;
    if (!basis_.nonbasicFlag_[iVar]) {
      basis_status = HighsBasisStatus::kBasic;
    } else if (basis_.nonbasicMove_[iVar] == kNonbasicMoveUp) {
      basis_status = HighsBasisStatus::kUpper;
    } else if (basis_.nonbasicMove_[iVar] == kNonbasicMoveDn) {
      basis_status = HighsBasisStatus::kLower;
    } else if (basis_.nonbasicMove_[iVar] == kNonbasicMoveZe) {
      if (lower == upper) {
        const double dual = (HighsInt)lp_.sense_ * info_.workDual_[iVar];
        basis_status =
            dual >= 0 ? HighsBasisStatus::kLower : HighsBasisStatus::kUpper;
      } else {
        basis_status = HighsBasisStatus::kZero;
      }
    }
    highs_basis.row_status[iRow] = basis_status;
  }
  highs_basis.valid = true;
  highs_basis.alien = false;
  highs_basis.useful = true;
  highs_basis.was_alien = false;
  highs_basis.debug_id =
      (HighsInt)(build_synthetic_tick_ + total_synthetic_tick_);
  highs_basis.debug_update_count = info_.update_count;
  highs_basis.debug_origin_name = basis_.debug_origin_name;
  return highs_basis;
}